

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  short sVar1;
  ImGuiID IVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  ImGuiTabItemFlags IVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ImGuiTabItem *in_RAX;
  ImGuiTabItem *pIVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ImGuiTabItem *pIVar16;
  ImGuiTabItem *pIVar17;
  ulong uVar18;
  bool bVar19;
  ImGuiTabItem item_tmp;
  undefined1 uStack_28;
  undefined3 uStack_27;
  undefined5 uStack_24;
  
  IVar2 = tab_bar->ReorderRequestTabId;
  if (IVar2 != 0) {
    uVar14 = (ulong)(tab_bar->Tabs).Size;
    bVar19 = 0 < (long)uVar14;
    if (0 < (long)uVar14) {
      in_RAX = (tab_bar->Tabs).Data;
      bVar19 = true;
      if (in_RAX->ID != IVar2) {
        pIVar16 = in_RAX + (uVar14 - 1);
        pIVar12 = in_RAX;
        uVar11 = 1;
        do {
          uVar18 = uVar11;
          in_RAX = pIVar16;
          if (uVar14 == uVar18) break;
          in_RAX = pIVar12 + 1;
          pIVar17 = pIVar12 + 1;
          pIVar12 = in_RAX;
          uVar11 = uVar18 + 1;
        } while (pIVar17->ID != IVar2);
        bVar19 = uVar18 < uVar14;
      }
    }
    if (bVar19) goto LAB_0022a2d3;
  }
  in_RAX = (ImGuiTabItem *)0x0;
LAB_0022a2d3:
  if ((in_RAX != (ImGuiTabItem *)0x0) && ((in_RAX->Flags & 0x20U) == 0)) {
    pIVar12 = (tab_bar->Tabs).Data;
    sVar1 = tab_bar->ReorderRequestOffset;
    uVar13 = (uint)sVar1;
    uVar15 = (int)((ulong)((long)in_RAX - (long)pIVar12) >> 2) * -0x45d1745d + uVar13;
    if ((-1 < (int)uVar15) && ((int)uVar15 < (tab_bar->Tabs).Size)) {
      if (((pIVar12[uVar15].Flags & 0x20U) == 0) &&
         (((pIVar12[uVar15].Flags ^ in_RAX->Flags) & 0xc0U) == 0)) {
        pIVar12 = pIVar12 + uVar15;
        IVar2 = in_RAX->ID;
        IVar8 = in_RAX->Flags;
        iVar9 = in_RAX->LastFrameVisible;
        iVar10 = in_RAX->LastFrameSelected;
        fVar6 = in_RAX->Offset;
        fVar7 = in_RAX->Width;
        uVar3._0_4_ = in_RAX->ContentWidth;
        uVar3._4_4_ = in_RAX->RequestedWidth;
        uVar4 = in_RAX->NameOffset;
        uVar5._0_2_ = in_RAX->BeginOrder;
        uVar5._2_2_ = in_RAX->IndexDuringLayout;
        uVar5._4_1_ = in_RAX->WantClose;
        uVar5._5_3_ = *(undefined3 *)&in_RAX->field_0x29;
        uStack_24 = (undefined5)uVar5;
        pIVar16 = in_RAX + 1;
        if (sVar1 < 1) {
          pIVar16 = pIVar12;
        }
        pIVar17 = pIVar12 + 1;
        if (0 < sVar1) {
          pIVar17 = in_RAX;
        }
        uVar15 = -uVar13;
        if (0 < (int)uVar13) {
          uVar15 = uVar13;
        }
        memmove(pIVar17,pIVar16,(ulong)uVar15 * 0x2c);
        uStack_28 = (undefined1)uVar4;
        uStack_27 = (undefined3)((uint)uVar4 >> 8);
        *(ulong *)((long)&pIVar12->ContentWidth + 1) = CONCAT17(uStack_28,(int7)((ulong)uVar3 >> 8))
        ;
        *(ulong *)((long)&pIVar12->NameOffset + 1) = CONCAT53(uStack_24,uStack_27);
        pIVar12->Offset = fVar6;
        pIVar12->Width = fVar7;
        pIVar12->ContentWidth = (float)(undefined4)uVar3;
        pIVar12->RequestedWidth = (float)uVar3._4_4_;
        pIVar12->ID = IVar2;
        pIVar12->Flags = IVar8;
        pIVar12->LastFrameVisible = iVar9;
        pIVar12->LastFrameSelected = iVar10;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}